

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello-imgui.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  ImDrawData *draw_data;
  exception *e;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  glfwWindowHint(0x22008,0x32001);
  fprintf(_stdout,"Loading {Window-Main}\n");
  fflush(_stdout);
  handle = glfwCreateWindow(0x400,0x300,"Hello Imgui",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    glfwTerminate();
    argv_local._4_4_ = -1;
  }
  else {
    glfwMakeContextCurrent(handle);
    glfwSetKeyCallback(handle,keyboardCallback);
    glfwSetCursorPosCallback(handle,mouseMotionCallback);
    glfwSetMouseButtonCallback(handle,mouseButtonCallback);
    glfwSetScrollCallback(handle,mouseScrollCallback);
    fprintf(_stdout,"Loading {OpenGL}\n");
    fflush(_stdout);
    iVar1 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar1 == 0) {
      fprintf(_stdout,"gladLoadGLLoader failed\n");
      fflush(_stdout);
      argv_local._4_4_ = -1;
    }
    else {
      fprintf(_stdout,"-- Begin -- Demo\n");
      fflush(_stdout);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui_ImplGlfwGL3_Init(handle,false,(char *)0x0);
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      while( true ) {
        iVar1 = glfwWindowShouldClose(handle);
        if (iVar1 != 0) break;
        glfwPollEvents();
        (*glad_glClearColor)(0.8,0.8,0.8,1.0);
        (*glad_glClear)(0x4000);
        ImGui_ImplGlfwGL3_NewFrame();
        renderGui();
        draw_data = ImGui::GetDrawData();
        ImGui_ImplGlfwGL3_RenderDrawData(draw_data);
        glfwSwapBuffers(handle);
      }
      ImGui_ImplGlfwGL3_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      glfwTerminate();
      fprintf(_stdout,"-- End -- Demo\n");
      fflush(_stdout);
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
	glfwInit();
	glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
	glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

	// Create the Window
	LOG("Loading {Window-Main}\n");
	GLFWwindow* window = glfwCreateWindow(1024, 768, "Hello Imgui", NULL, NULL);
	if (window == NULL) {
		LOG("=> Failure <=\n");
		glfwTerminate();
		return -1;
	}
	glfwMakeContextCurrent(window);
	glfwSetKeyCallback(window, &keyboardCallback);
	glfwSetCursorPosCallback(window, &mouseMotionCallback);
	glfwSetMouseButtonCallback(window, &mouseButtonCallback);
	glfwSetScrollCallback(window, &mouseScrollCallback);

	// Load OpenGL functions
	LOG("Loading {OpenGL}\n");
	if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
		LOG("gladLoadGLLoader failed\n");
		return -1;
	}

	LOG("-- Begin -- Demo\n");
	try {
		ImGui::CreateContext();
		ImGui_ImplGlfwGL3_Init(window, false);
		ImGui::StyleColorsDark();

		while (!glfwWindowShouldClose(window)) {
			glfwPollEvents();

			glClearColor(0.8f, 0.8f, 0.8f, 1.0f);
			glClear(GL_COLOR_BUFFER_BIT);
			ImGui_ImplGlfwGL3_NewFrame();
			renderGui();
			ImGui_ImplGlfwGL3_RenderDrawData(ImGui::GetDrawData());
			glfwSwapBuffers(window);
		}

		ImGui_ImplGlfwGL3_Shutdown();
		ImGui::DestroyContext();
		glfwTerminate();
	} catch (std::exception& e) {
		LOG("%s", e.what());
		ImGui_ImplGlfwGL3_Shutdown();
		ImGui::DestroyContext();
		glfwTerminate();
		LOG("(!) Demo Killed (!)\n");

		return EXIT_FAILURE;
	} catch (...) {
		ImGui_ImplGlfwGL3_Shutdown();
		ImGui::DestroyContext();
		glfwTerminate();
		LOG("(!) Demo Killed (!)\n");

		return EXIT_FAILURE;
	}
	LOG("-- End -- Demo\n");


	return 0;
}